

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O3

void __thiscall
sglr::ReferenceContext::acquireFboAttachmentReference(ReferenceContext *this,Attachment *attachment)

{
  int *piVar1;
  _Rb_tree_color _Var2;
  TestError *this_00;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  bool bVar6;
  
  if (attachment->type == ATTACHMENTTYPE_RENDERBUFFER) {
    _Var2 = attachment->name;
    if (_Var2 == _S_red) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,(char *)0x0,"attachment.name != 0",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                 ,0x78a);
    }
    else {
      p_Var3 = (this->m_renderbuffers).m_objects._M_t._M_impl.super__Rb_tree_header._M_header.
               _M_parent;
      if (p_Var3 != (_Base_ptr)0x0) {
        p_Var5 = &(this->m_renderbuffers).m_objects._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = &p_Var5->_M_header;
        do {
          bVar6 = p_Var3[1]._M_color < _Var2;
          if (!bVar6) {
            p_Var4 = p_Var3;
          }
          p_Var3 = (&p_Var3->_M_left)[bVar6];
        } while (p_Var3 != (_Base_ptr)0x0);
        if ((((_Rb_tree_header *)p_Var4 != p_Var5) && (p_Var4[1]._M_color <= _Var2)) &&
           (p_Var3 = p_Var4[1]._M_parent, p_Var3 != (_Base_ptr)0x0)) goto LAB_018a50c3;
      }
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,(char *)0x0,"rbo",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                 ,0x78c);
    }
  }
  else {
    if (attachment->type != ATTACHMENTTYPE_TEXTURE) {
      return;
    }
    _Var2 = attachment->name;
    if (_Var2 == _S_red) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,(char *)0x0,"attachment.name != 0",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                 ,0x781);
    }
    else {
      p_Var3 = (this->m_textures).m_objects._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (p_Var3 != (_Base_ptr)0x0) {
        p_Var5 = &(this->m_textures).m_objects._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = &p_Var5->_M_header;
        do {
          bVar6 = p_Var3[1]._M_color < _Var2;
          if (!bVar6) {
            p_Var4 = p_Var3;
          }
          p_Var3 = (&p_Var3->_M_left)[bVar6];
        } while (p_Var3 != (_Base_ptr)0x0);
        if ((((_Rb_tree_header *)p_Var4 != p_Var5) && (p_Var4[1]._M_color <= _Var2)) &&
           (p_Var3 = p_Var4[1]._M_parent, p_Var3 != (_Base_ptr)0x0)) {
LAB_018a50c3:
          piVar1 = (int *)((long)&p_Var3->_M_parent + 4);
          *piVar1 = *piVar1 + 1;
          return;
        }
      }
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,(char *)0x0,"texture",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                 ,0x783);
    }
  }
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ReferenceContext::acquireFboAttachmentReference (const Framebuffer::Attachment& attachment)
{
	switch (attachment.type)
	{
		case Framebuffer::ATTACHMENTTYPE_TEXTURE:
		{
			TCU_CHECK(attachment.name != 0);
			Texture* texture = m_textures.find(attachment.name);
			TCU_CHECK(texture);
			m_textures.acquireReference(texture);
			break;
		}

		case Framebuffer::ATTACHMENTTYPE_RENDERBUFFER:
		{
			TCU_CHECK(attachment.name != 0);
			Renderbuffer* rbo = m_renderbuffers.find(attachment.name);
			TCU_CHECK(rbo);
			m_renderbuffers.acquireReference(rbo);
			break;
		}

		default:
			break; // Silently ignore
	}
}